

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O0

iterator CLI::detail::find_matching_config
                   (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *items,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *parents,string *name,bool fullSearch)

{
  bool bVar1;
  __type _Var2;
  pointer pCVar3;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  local_48;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  local_40;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  local_38;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  search;
  bool fullSearch_local;
  string *name_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parents_local;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *items_local;
  
  search._M_current._7_1_ = fullSearch;
  bVar1 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::empty(items);
  if (bVar1) {
    items_local = (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end(items);
  }
  else {
    local_40._M_current =
         (ConfigItem *)std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end(items);
    local_38 = __gnu_cxx::
               __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
               ::operator-(&local_40,1);
    do {
      pCVar3 = __gnu_cxx::
               __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
               ::operator->(&local_38);
      bVar1 = ::std::operator==(&pCVar3->parents,parents);
      if (bVar1) {
        pCVar3 = __gnu_cxx::
                 __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                 ::operator->(&local_38);
        _Var2 = ::std::operator==(&pCVar3->name,name);
        if (_Var2) {
          return (iterator)local_38._M_current;
        }
      }
      local_48._M_current =
           (ConfigItem *)
           std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::begin(items);
      bVar1 = __gnu_cxx::operator==(&local_38,&local_48);
    } while ((!bVar1) &&
            (__gnu_cxx::
             __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
             ::operator--(&local_38), (search._M_current._7_1_ & 1) != 0));
    items_local = (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end(items);
  }
  return (iterator)(ConfigItem *)items_local;
}

Assistant:

inline auto find_matching_config(std::vector<ConfigItem> &items,
                                 const std::vector<std::string> &parents,
                                 const std::string &name,
                                 bool fullSearch) -> decltype(items.begin()) {
    if(items.empty()) {
        return items.end();
    }
    auto search = items.end() - 1;
    do {
        if(search->parents == parents && search->name == name) {
            return search;
        }
        if(search == items.begin()) {
            break;
        }
        --search;
    } while(fullSearch);
    return items.end();
}